

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  
  lVar1 = d->v[0];
  lVar2 = d->v[4];
  lVar3 = e->v[4];
  uVar4 = t->u;
  uVar5 = t->v;
  uVar6 = t->q;
  uVar7 = t->r;
  lVar11 = (uVar5 & lVar3 >> 0x3f) + (uVar4 & lVar2 >> 0x3f);
  lVar20 = (lVar3 >> 0x3f & uVar7) + (lVar2 >> 0x3f & uVar6);
  lVar19 = e->v[0];
  uVar13 = uVar5 * lVar19 + uVar4 * lVar1;
  uVar17 = uVar7 * lVar19 + uVar6 * lVar1;
  lVar11 = lVar11 - (modinfo->modulus_inv62 * uVar13 + lVar11 & 0x3fffffffffffffff);
  lVar20 = lVar20 - (modinfo->modulus_inv62 * uVar17 + lVar20 & 0x3fffffffffffffff);
  lVar8 = (modinfo->modulus).v[0];
  lVar9 = SUB168(SEXT816(lVar11) * SEXT816(lVar8),8) +
          SUB168(SEXT816((long)uVar5) * SEXT816(lVar19),8) +
          SUB168(SEXT816((long)uVar4) * SEXT816(lVar1),8) +
          (ulong)CARRY8(uVar5 * lVar19,uVar4 * lVar1) + (ulong)CARRY8(lVar11 * lVar8,uVar13);
  lVar14 = SUB168(SEXT816(lVar20) * SEXT816(lVar8),8) +
           SUB168(SEXT816((long)uVar7) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar7 * lVar19,uVar6 * lVar1) + (ulong)CARRY8(lVar20 * lVar8,uVar17);
  uVar13 = lVar9 * 4 | lVar11 * lVar8 + uVar13 >> 0x3e;
  uVar15 = lVar14 * 4 | lVar20 * lVar8 + uVar17 >> 0x3e;
  lVar1 = d->v[1];
  lVar19 = e->v[1];
  uVar17 = uVar5 * lVar19 + uVar4 * lVar1;
  uVar18 = uVar17 + uVar13;
  lVar9 = SUB168(SEXT816((long)uVar5) * SEXT816(lVar19),8) +
          SUB168(SEXT816((long)uVar4) * SEXT816(lVar1),8) +
          (ulong)CARRY8(uVar5 * lVar19,uVar4 * lVar1) + (lVar9 >> 0x3e) +
          (ulong)CARRY8(uVar17,uVar13);
  uVar13 = uVar7 * lVar19 + uVar6 * lVar1;
  uVar17 = uVar13 + uVar15;
  lVar14 = SUB168(SEXT816((long)uVar7) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar7 * lVar19,uVar6 * lVar1) + (lVar14 >> 0x3e) +
           (ulong)CARRY8(uVar13,uVar15);
  lVar1 = d->v[2];
  lVar19 = e->v[2];
  lVar8 = (modinfo->modulus).v[1];
  if (lVar8 != 0) {
    bVar23 = CARRY8(uVar18,lVar11 * lVar8);
    uVar18 = uVar18 + lVar11 * lVar8;
    lVar9 = lVar9 + SUB168(SEXT816(lVar11) * SEXT816(lVar8),8) + (ulong)bVar23;
    bVar23 = CARRY8(uVar17,lVar20 * lVar8);
    uVar17 = uVar17 + lVar20 * lVar8;
    lVar14 = lVar14 + SUB168(SEXT816(lVar20) * SEXT816(lVar8),8) + (ulong)bVar23;
  }
  uVar10 = lVar9 << 2 | uVar18 >> 0x3e;
  uVar12 = lVar14 << 2 | uVar17 >> 0x3e;
  uVar13 = uVar5 * lVar19 + uVar4 * lVar1;
  uVar15 = uVar13 + uVar10;
  lVar8 = d->v[3];
  lVar16 = SUB168(SEXT816((long)uVar5) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar4) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar5 * lVar19,uVar4 * lVar1) + (lVar9 >> 0x3e) +
           (ulong)CARRY8(uVar13,uVar10);
  lVar9 = e->v[3];
  d->v[0] = uVar18 & 0x3fffffffffffffff;
  e->v[0] = uVar17 & 0x3fffffffffffffff;
  uVar13 = uVar7 * lVar19 + uVar6 * lVar1;
  uVar17 = uVar13 + uVar12;
  lVar19 = SUB168(SEXT816((long)uVar7) * SEXT816(lVar19),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar1),8) +
           (ulong)CARRY8(uVar7 * lVar19,uVar6 * lVar1) + (lVar14 >> 0x3e) +
           (ulong)CARRY8(uVar13,uVar12);
  lVar1 = (modinfo->modulus).v[2];
  if (lVar1 != 0) {
    bVar23 = CARRY8(uVar15,lVar1 * lVar11);
    uVar15 = uVar15 + lVar1 * lVar11;
    lVar16 = lVar16 + SUB168(SEXT816(lVar1) * SEXT816(lVar11),8) + (ulong)bVar23;
    bVar23 = CARRY8(uVar17,lVar1 * lVar20);
    uVar17 = uVar17 + lVar1 * lVar20;
    lVar19 = lVar19 + SUB168(SEXT816(lVar1) * SEXT816(lVar20),8) + (ulong)bVar23;
  }
  uVar13 = lVar16 << 2 | uVar15 >> 0x3e;
  uVar18 = lVar19 << 2 | uVar17 >> 0x3e;
  uVar10 = uVar5 * lVar9 + uVar4 * lVar8;
  uVar12 = uVar10 + uVar13;
  lVar14 = SUB168(SEXT816((long)uVar5) * SEXT816(lVar9),8) +
           SUB168(SEXT816((long)uVar4) * SEXT816(lVar8),8) +
           (ulong)CARRY8(uVar5 * lVar9,uVar4 * lVar8) + (lVar16 >> 0x3e) +
           (ulong)CARRY8(uVar10,uVar13);
  d->v[1] = uVar15 & 0x3fffffffffffffff;
  e->v[1] = uVar17 & 0x3fffffffffffffff;
  uVar13 = uVar7 * lVar9 + uVar6 * lVar8;
  uVar17 = uVar13 + uVar18;
  lVar19 = SUB168(SEXT816((long)uVar7) * SEXT816(lVar9),8) +
           SUB168(SEXT816((long)uVar6) * SEXT816(lVar8),8) +
           (ulong)CARRY8(uVar7 * lVar9,uVar6 * lVar8) + (lVar19 >> 0x3e) +
           (ulong)CARRY8(uVar13,uVar18);
  lVar1 = (modinfo->modulus).v[3];
  if (lVar1 != 0) {
    bVar23 = CARRY8(uVar12,lVar1 * lVar11);
    uVar12 = uVar12 + lVar1 * lVar11;
    lVar14 = lVar14 + SUB168(SEXT816(lVar1) * SEXT816(lVar11),8) + (ulong)bVar23;
    bVar23 = CARRY8(uVar17,lVar1 * lVar20);
    uVar17 = uVar17 + lVar1 * lVar20;
    lVar19 = lVar19 + SUB168(SEXT816(lVar1) * SEXT816(lVar20),8) + (ulong)bVar23;
  }
  uVar10 = lVar14 << 2 | uVar12 >> 0x3e;
  d->v[2] = uVar12 & 0x3fffffffffffffff;
  uVar18 = lVar19 << 2 | uVar17 >> 0x3e;
  e->v[2] = uVar17 & 0x3fffffffffffffff;
  uVar17 = uVar5 * lVar3 + uVar4 * lVar2;
  uVar15 = uVar17 + uVar10;
  uVar12 = uVar7 * lVar3 + uVar6 * lVar2;
  uVar21 = uVar12 + uVar18;
  lVar1 = (modinfo->modulus).v[4];
  uVar22 = lVar1 * lVar11 + uVar15;
  uVar13 = lVar1 * lVar20 + uVar21;
  d->v[3] = uVar22 & 0x3fffffffffffffff;
  e->v[3] = uVar13 & 0x3fffffffffffffff;
  d->v[4] = (SUB168(SEXT816(lVar1) * SEXT816(lVar11),8) +
             SUB168(SEXT816((long)uVar5) * SEXT816(lVar3),8) +
             SUB168(SEXT816((long)uVar4) * SEXT816(lVar2),8) +
             (ulong)CARRY8(uVar5 * lVar3,uVar4 * lVar2) + (lVar14 >> 0x3e) +
             (ulong)CARRY8(uVar17,uVar10) + (ulong)CARRY8(lVar1 * lVar11,uVar15)) * 4 |
            uVar22 >> 0x3e;
  e->v[4] = (SUB168(SEXT816(lVar1) * SEXT816(lVar20),8) +
             SUB168(SEXT816((long)uVar7) * SEXT816(lVar3),8) +
             SUB168(SEXT816((long)uVar6) * SEXT816(lVar2),8) +
             (ulong)CARRY8(uVar7 * lVar3,uVar6 * lVar2) + (lVar19 >> 0x3e) +
             (ulong)CARRY8(uVar12,uVar18) + (ulong)CARRY8(lVar1 * lVar20,uVar21)) * 4 |
            uVar13 >> 0x3e;
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    int128_t cd, ce;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK((secp256k1_modinv64_abs(u) + secp256k1_modinv64_abs(v)) >= 0); /* |u|+|v| doesn't overflow */
    VERIFY_CHECK((secp256k1_modinv64_abs(q) + secp256k1_modinv64_abs(r)) >= 0); /* |q|+|r| doesn't overflow */
    VERIFY_CHECK((secp256k1_modinv64_abs(u) + secp256k1_modinv64_abs(v)) <= M62 + 1); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK((secp256k1_modinv64_abs(q) + secp256k1_modinv64_abs(r)) <= M62 + 1); /* |q|+|r| <= 2^62 */
#endif
    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    cd = (int128_t)u * d0 + (int128_t)v * e0;
    ce = (int128_t)q * d0 + (int128_t)r * e0;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * (uint64_t)cd + md) & M62;
    me -= (modinfo->modulus_inv62 * (uint64_t)ce + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int128_t)modinfo->modulus.v[0] * md;
    ce += (int128_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int64_t)cd & M62) == 0); cd >>= 62;
    VERIFY_CHECK(((int64_t)ce & M62) == 0); ce >>= 62;
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    cd += (int128_t)u * d1 + (int128_t)v * e1;
    ce += (int128_t)q * d1 + (int128_t)r * e1;
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        cd += (int128_t)modinfo->modulus.v[1] * md;
        ce += (int128_t)modinfo->modulus.v[1] * me;
    }
    d->v[0] = (int64_t)cd & M62; cd >>= 62;
    e->v[0] = (int64_t)ce & M62; ce >>= 62;
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    cd += (int128_t)u * d2 + (int128_t)v * e2;
    ce += (int128_t)q * d2 + (int128_t)r * e2;
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        cd += (int128_t)modinfo->modulus.v[2] * md;
        ce += (int128_t)modinfo->modulus.v[2] * me;
    }
    d->v[1] = (int64_t)cd & M62; cd >>= 62;
    e->v[1] = (int64_t)ce & M62; ce >>= 62;
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    cd += (int128_t)u * d3 + (int128_t)v * e3;
    ce += (int128_t)q * d3 + (int128_t)r * e3;
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        cd += (int128_t)modinfo->modulus.v[3] * md;
        ce += (int128_t)modinfo->modulus.v[3] * me;
    }
    d->v[2] = (int64_t)cd & M62; cd >>= 62;
    e->v[2] = (int64_t)ce & M62; ce >>= 62;
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    cd += (int128_t)u * d4 + (int128_t)v * e4;
    ce += (int128_t)q * d4 + (int128_t)r * e4;
    cd += (int128_t)modinfo->modulus.v[4] * md;
    ce += (int128_t)modinfo->modulus.v[4] * me;
    d->v[3] = (int64_t)cd & M62; cd >>= 62;
    e->v[3] = (int64_t)ce & M62; ce >>= 62;
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = (int64_t)cd;
    e->v[4] = (int64_t)ce;
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
#endif
}